

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aom_convolve.c
# Opt level: O3

void aom_highbd_convolve8_vert_c
               (uint8_t *src,ptrdiff_t src_stride,uint8_t *dst,ptrdiff_t dst_stride,
               int16_t *filter_x,int x_step_q4,int16_t *filter_y,int y_step_q4,int w,int h,int bd)

{
  undefined2 uVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  ulong uVar9;
  uint uVar10;
  ushort *puVar11;
  
  if (0 < w) {
    lVar8 = (long)src * 2 + src_stride * -6;
    lVar5 = (long)dst * 2;
    iVar3 = 0;
    do {
      if (0 < h) {
        uVar9 = 0;
        uVar10 = (uint)((ulong)filter_y >> 4) & 0xf;
        do {
          puVar11 = (ushort *)((long)((int)uVar10 >> 4) * src_stride * 2 + lVar8);
          lVar4 = 0;
          iVar6 = 0;
          do {
            iVar6 = iVar6 + (int)*(short *)((ulong)((uVar10 & 0xf) << 4) +
                                            ((ulong)filter_y & 0xffffffffffffff00) + lVar4 * 2) *
                            (uint)*puVar11;
            lVar4 = lVar4 + 1;
            puVar11 = puVar11 + src_stride;
          } while (lVar4 != 8);
          uVar7 = iVar6 + 0x40 >> 7;
          if (bd == 10) {
            uVar2 = 0x3ff;
          }
          else if (bd == 0xc) {
            uVar2 = 0xfff;
          }
          else {
            uVar2 = 0xff;
          }
          if (uVar7 < uVar2) {
            uVar2 = uVar7;
          }
          uVar1 = (undefined2)uVar2;
          if ((int)uVar7 < 0) {
            uVar1 = 0;
          }
          *(undefined2 *)(lVar5 + uVar9 * dst_stride * 2) = uVar1;
          uVar10 = uVar10 + y_step_q4;
          uVar9 = uVar9 + 1;
        } while (uVar9 != (uint)h);
      }
      lVar8 = lVar8 + 2;
      lVar5 = lVar5 + 2;
      iVar3 = iVar3 + 1;
    } while (iVar3 != w);
  }
  return;
}

Assistant:

static void highbd_convolve_vert(const uint8_t *src8, ptrdiff_t src_stride,
                                 uint8_t *dst8, ptrdiff_t dst_stride,
                                 const InterpKernel *y_filters, int y0_q4,
                                 int y_step_q4, int w, int h, int bd) {
  uint16_t *src = CONVERT_TO_SHORTPTR(src8);
  uint16_t *dst = CONVERT_TO_SHORTPTR(dst8);
  src -= src_stride * (SUBPEL_TAPS / 2 - 1);
  for (int x = 0; x < w; ++x) {
    int y_q4 = y0_q4;
    for (int y = 0; y < h; ++y) {
      const uint16_t *src_y = &src[(y_q4 >> SUBPEL_BITS) * src_stride];
      const int16_t *const y_filter = y_filters[y_q4 & SUBPEL_MASK];
      const int sum = highbd_vert_scalar_product(src_y, src_stride, y_filter);
      dst[y * dst_stride] =
          clip_pixel_highbd(ROUND_POWER_OF_TWO(sum, FILTER_BITS), bd);
      y_q4 += y_step_q4;
    }
    ++src;
    ++dst;
  }
}